

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.hpp
# Opt level: O2

void __thiscall Path::arc_to(Path *this,Point r,float rotation,bool large_arc,bool sweep,Point *end)

{
  Point PVar1;
  Point PVar2;
  float fVar3;
  float fVar4;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Transformation t;
  float local_138;
  float fStack_134;
  float local_128;
  float local_108;
  Transformation local_98;
  Transformation local_80;
  Transformation local_68;
  Transformation local_50;
  Transformation local_38;
  
  local_128 = r.x;
  local_108 = r.y;
  if (((local_128 != 0.0) || (NAN(local_128))) && ((local_108 != 0.0 || (NAN(local_108))))) {
    PVar2 = current_point(this);
    fVar3 = cosf(-rotation);
    fVar4 = sinf(-rotation);
    local_138 = PVar2.x;
    fVar8 = (local_138 - end->x) * 0.5;
    fVar9 = (PVar2.y - end->y) * 0.5;
    fVar11 = fVar8 * fVar4 + fVar9 * fVar3 + 0.0;
    fVar12 = fVar8 * fVar3 + fVar9 * -fVar4 + 0.0;
    fVar4 = local_128 * local_128 * fVar11;
    fVar7 = local_108 * local_128 * local_128 * local_108;
    fVar10 = local_108 * local_108 * fVar12;
    fVar3 = (fVar7 - fVar11 * fVar4) - fVar12 * fVar10;
    if (0.0 <= fVar3) {
      fVar3 = fVar3 / (fVar4 * fVar11 + fVar10 * fVar12);
      if (fVar3 < 0.0) {
        fVar3 = sqrtf(fVar3);
      }
      else {
        fVar3 = SQRT(fVar3);
      }
      auVar5._0_4_ = local_128 * fVar11;
      auVar5._4_4_ = -local_108 * fVar12;
      auVar5._8_4_ = in_XMM0_Dc * (fVar8 * extraout_XMM0_Db_00 + fVar9 * extraout_XMM0_Db + 0.0);
      auVar5._12_4_ = in_XMM0_Dd * (fVar8 * extraout_XMM0_Db + fVar9 * -extraout_XMM0_Db_00 + 0.0);
      auVar6._4_4_ = local_128;
      auVar6._0_4_ = local_108;
      auVar6._8_4_ = in_XMM0_Dc;
      auVar6._12_4_ = in_XMM0_Dd;
      auVar6 = divps(auVar5,auVar6);
      fVar4 = fVar3 * auVar6._0_4_;
      fVar3 = fVar3 * auVar6._4_4_;
      if (large_arc == sweep) {
        fVar4 = -fVar4;
        fVar3 = -fVar3;
      }
    }
    else {
      fVar3 = 1.0 - fVar3 / fVar7;
      if (fVar3 < 0.0) {
        fVar3 = sqrtf(fVar3);
      }
      else {
        fVar3 = SQRT(fVar3);
      }
      local_128 = local_128 * fVar3;
      local_108 = local_108 * fVar3;
      fVar4 = 0.0;
      fVar3 = 0.0;
    }
    fVar8 = cosf(rotation);
    fVar9 = sinf(rotation);
    PVar1 = *end;
    local_98.b = (fVar12 - fVar4) * 0.0 + (fVar11 - fVar3) * (1.0 / local_108) + 0.0;
    local_98.a = (fVar12 - fVar4) * (1.0 / local_128) + (fVar11 - fVar3) * 0.0 + 0.0;
    fVar10 = angle((Point *)&local_98);
    local_98.a = (-fVar12 - fVar4) * (1.0 / local_128) + (-fVar11 - fVar3) * 0.0 + 0.0;
    local_98.b = (-fVar12 - fVar4) * 0.0 + (-fVar11 - fVar3) * (1.0 / local_108) + 0.0;
    fVar7 = angle((Point *)&local_98);
    fVar7 = fVar7 - fVar10;
    if (0.0 < fVar7 && !sweep) {
      fVar7 = fVar7 + -6.2831855;
    }
    else if (sweep && fVar7 < 0.0) {
      fVar7 = fVar7 + 6.2831855;
    }
    local_68.a = 1.0;
    local_68.b = 0.0;
    local_68.c = 0.0;
    local_68.d = 1.0;
    local_68.e = (local_138 + PVar1.x) * 0.5 + fVar4 * fVar8 + -fVar9 * fVar3 + 0.0;
    local_68.f = (PVar2.y + PVar1.y) * 0.5 + fVar4 * fVar9 + fVar8 * fVar3 + 0.0;
    fVar3 = cosf(rotation);
    local_38.b = sinf(rotation);
    local_38.c = -local_38.b;
    local_38.e = 0.0;
    local_38.f = 0.0;
    local_38.a = fVar3;
    local_38.d = fVar3;
    operator*(&local_68,&local_38);
    local_50.a = local_128;
    local_50.b = 0.0;
    local_50.c = 0.0;
    local_50.d = local_108;
    local_50.e = 0.0;
    local_50.f = 0.0;
    operator*(&local_80,&local_50);
    local_80.a = 0.0;
    local_80.b = 0.0;
    add_arc(this,(Point *)&local_80,1.0,fVar10,fVar7,&local_98);
    return;
  }
  line_to(this,end);
  return;
}

Assistant:

void arc_to(Point r, float rotation, bool large_arc, bool sweep, const Point& end) {
		if (r.x == 0.f || r.y == 0.f) {
			line_to(end);
			return;
		}
		const Point& start = current_point();
		const Point p = Transformation::rotate(-rotation) * ((start - end) * .5f);
		Point c(0.f, 0.f);
		const float numerator = (r.x*r.x * r.y*r.y - r.x*r.x * p.y*p.y - r.y*r.y * p.x*p.x);
		if (numerator < 0.f) {
			r = r * std::sqrt(1.f - numerator / (r.x*r.x * r.y*r.y));
		}
		else {
			const float denominator = (r.x*r.x * p.y*p.y + r.y*r.y * p.x*p.x);
			c = Point(r.x*p.y/r.y, -r.y*p.x/r.x) * std::sqrt(numerator / denominator);
			if (large_arc == sweep) {
				c = c * -1.f;
			}
		}
		const Point center = Transformation::rotate(rotation) * c + (start + end) * .5f;
		const float start_angle = angle(Transformation::scale(1.f / r.x, 1.f / r.y) * (p - c));
		const float end_angle = angle(Transformation::scale(1.f / r.x, 1.f / r.y) * (-p - c));
		float sweep_angle = end_angle - start_angle;
		if (sweep == false && sweep_angle > 0.f) {
			sweep_angle -= 2.f * M_PI;
		}
		else if (sweep == true && sweep_angle < 0.f) {
			sweep_angle += 2.f * M_PI;
		}
		const Transformation t = Transformation::translate(center.x, center.y) * Transformation::rotate(rotation) * Transformation::scale(r.x, r.y);
		add_arc(Point(0.f, 0.f), 1.f, start_angle, sweep_angle, t);
	}